

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  xmlChar **ppxVar6;
  bool bVar7;
  xmlChar **n;
  unsigned_long cons;
  int id;
  int i;
  int maxatts;
  int nbatts;
  xmlChar **atts;
  xmlChar *attvalue;
  xmlChar *attname;
  xmlChar *name;
  xmlParserCtxtPtr ctxt_local;
  
  _maxatts = ctxt->atts;
  i = 0;
  id = ctxt->maxatts;
  if (*ctxt->input->cur == '<') {
    ctxt->input->col = ctxt->input->col + 1;
    ctxt->input->cur = ctxt->input->cur + 1;
    name = (xmlChar *)ctxt;
    if (*ctxt->input->cur == '\0') {
      xmlParserInputGrow(ctxt->input,0xfa);
    }
    attname = xmlParseName((xmlParserCtxtPtr)name);
    if (attname == (xmlChar *)0x0) {
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_NAME_REQUIRED,
                     "xmlParseStartTag: invalid element name\n");
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      xmlSkipBlankChars((xmlParserCtxtPtr)name);
      if ((*(int *)(name + 0x1c4) == 0) &&
         (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) < 0xfa
         )) {
        xmlGROW((xmlParserCtxtPtr)name);
      }
LAB_0017f095:
      bVar7 = false;
      if (((**(char **)(*(long *)(name + 0x38) + 0x20) != '>') &&
          ((**(char **)(*(long *)(name + 0x38) + 0x20) != '/' ||
           (bVar7 = false, *(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) != '>')))) &&
         (((8 < **(byte **)(*(long *)(name + 0x38) + 0x20) &&
           (**(byte **)(*(long *)(name + 0x38) + 0x20) < 0xb)) ||
          ((**(char **)(*(long *)(name + 0x38) + 0x20) == '\r' ||
           (bVar7 = false, 0x1f < **(byte **)(*(long *)(name + 0x38) + 0x20))))))) {
        bVar7 = *(int *)(name + 0x110) != -1;
      }
      if (!bVar7) goto LAB_0017f52e;
      iVar1 = *(int *)(*(long *)(name + 0x38) + 100);
      lVar2 = *(long *)(*(long *)(name + 0x38) + 0x40);
      lVar3 = *(long *)(*(long *)(name + 0x38) + 0x20);
      lVar4 = *(long *)(*(long *)(name + 0x38) + 0x18);
      attvalue = xmlParseAttribute((xmlParserCtxtPtr)name,(xmlChar **)&atts);
      if ((attvalue == (xmlChar *)0x0) || (atts == (xmlChar **)0x0)) {
        if (atts != (xmlChar **)0x0) {
          (*xmlFree)(atts);
        }
      }
      else {
        for (cons._4_4_ = 0; cons._4_4_ < i; cons._4_4_ = cons._4_4_ + 2) {
          iVar5 = xmlStrEqual(_maxatts[cons._4_4_],attvalue);
          if (iVar5 != 0) {
            xmlErrAttributeDup((xmlParserCtxtPtr)name,(xmlChar *)0x0,attvalue);
            (*xmlFree)(atts);
            goto LAB_0017f38b;
          }
        }
        if (_maxatts == (xmlChar **)0x0) {
          id = 0x16;
          _maxatts = (xmlChar **)(*xmlMalloc)(0xb0);
          if (_maxatts == (xmlChar **)0x0) {
            xmlErrMemory((xmlParserCtxtPtr)name,(char *)0x0);
            if (atts != (xmlChar **)0x0) {
              (*xmlFree)(atts);
            }
            goto LAB_0017f38b;
          }
          *(xmlChar ***)(name + 0x1d0) = _maxatts;
          name[0x1d8] = '\x16';
          name[0x1d9] = '\0';
          name[0x1da] = '\0';
          name[0x1db] = '\0';
        }
        else if (id < i + 4) {
          id = id << 1;
          ppxVar6 = (xmlChar **)(*xmlRealloc)(_maxatts,(long)id << 3);
          if (ppxVar6 == (xmlChar **)0x0) {
            xmlErrMemory((xmlParserCtxtPtr)name,(char *)0x0);
            if (atts != (xmlChar **)0x0) {
              (*xmlFree)(atts);
            }
            goto LAB_0017f38b;
          }
          *(xmlChar ***)(name + 0x1d0) = ppxVar6;
          *(int *)(name + 0x1d8) = id;
          _maxatts = ppxVar6;
        }
        _maxatts[i] = attvalue;
        _maxatts[i + 1] = (xmlChar *)atts;
        _maxatts[i + 2] = (xmlChar *)0x0;
        _maxatts[i + 3] = (xmlChar *)0x0;
        i = i + 2;
      }
LAB_0017f38b:
      if ((*(int *)(name + 0x1c4) == 0) &&
         (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) < 0xfa
         )) {
        xmlGROW((xmlParserCtxtPtr)name);
      }
      if ((**(char **)(*(long *)(name + 0x38) + 0x20) == '>') ||
         ((**(char **)(*(long *)(name + 0x38) + 0x20) == '/' &&
          (*(char *)(*(long *)(*(long *)(name + 0x38) + 0x20) + 1) == '>')))) goto LAB_0017f52e;
      iVar5 = xmlSkipBlankChars((xmlParserCtxtPtr)name);
      if (iVar5 == 0) {
        xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_SPACE_REQUIRED,"attributes construct error\n")
        ;
      }
      if ((((lVar2 + (lVar3 - lVar4) !=
             *(long *)(*(long *)(name + 0x38) + 0x40) +
             (*(long *)(*(long *)(name + 0x38) + 0x20) - *(long *)(*(long *)(name + 0x38) + 0x18)))
           || (iVar1 != *(int *)(*(long *)(name + 0x38) + 100))) || (attvalue != (xmlChar *)0x0)) ||
         (atts != (xmlChar **)0x0)) {
        if (((*(int *)(name + 0x1c4) == 0) &&
            (500 < *(long *)(*(long *)(name + 0x38) + 0x20) -
                   *(long *)(*(long *)(name + 0x38) + 0x18))) &&
           (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) <
            500)) {
          xmlSHRINK((xmlParserCtxtPtr)name);
        }
        if ((*(int *)(name + 0x1c4) == 0) &&
           (*(long *)(*(long *)(name + 0x38) + 0x28) - *(long *)(*(long *)(name + 0x38) + 0x20) <
            0xfa)) {
          xmlGROW((xmlParserCtxtPtr)name);
        }
        goto LAB_0017f095;
      }
      xmlFatalErrMsg((xmlParserCtxtPtr)name,XML_ERR_INTERNAL_ERROR,
                     "xmlParseStartTag: problem parsing attributes\n");
LAB_0017f52e:
      if (((*(long *)name != 0) && (*(long *)(*(long *)name + 0x70) != 0)) &&
         (*(int *)(name + 0x14c) == 0)) {
        if (i < 1) {
          (**(code **)(*(long *)name + 0x70))(*(undefined8 *)(name + 8),attname,0);
        }
        else {
          (**(code **)(*(long *)name + 0x70))(*(undefined8 *)(name + 8),attname,_maxatts);
        }
      }
      if (_maxatts != (xmlChar **)0x0) {
        for (cons._4_4_ = 1; cons._4_4_ < i; cons._4_4_ = cons._4_4_ + 2) {
          if (_maxatts[cons._4_4_] != (xmlChar *)0x0) {
            (*xmlFree)(_maxatts[cons._4_4_]);
          }
        }
      }
      ctxt_local = (xmlParserCtxtPtr)attname;
    }
  }
  else {
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (ctxt->instate != XML_PARSER_EOF)) {
        int id = ctxt->input->id;
	unsigned long cons = CUR_CONSUMED;

	attname = xmlParseAttribute(ctxt, &attvalue);
        if ((attname != NULL) && (attvalue != NULL)) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    xmlFree(attvalue);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (atts == NULL) {
	        maxatts = 22; /* allow for 10 attrs by default */
	        atts = (const xmlChar **)
		       xmlMalloc(maxatts * sizeof(xmlChar *));
		if (atts == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    } else if (nbatts + 4 > maxatts) {
	        const xmlChar **n;

	        maxatts *= 2;
	        n = (const xmlChar **) xmlRealloc((void *) atts,
					     maxatts * sizeof(const xmlChar *));
		if (n == NULL) {
		    xmlErrMemory(ctxt, NULL);
		    if (attvalue != NULL)
			xmlFree(attvalue);
		    goto failed;
		}
		atts = n;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }
	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;
	} else {
	    if (attvalue != NULL)
		xmlFree(attvalue);
	}

failed:

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
        if ((cons == CUR_CONSUMED) && (id == ctxt->input->id) &&
            (attname == NULL) && (attvalue == NULL)) {
	    xmlFatalErrMsg(ctxt, XML_ERR_INTERNAL_ERROR,
			   "xmlParseStartTag: problem parsing attributes\n");
	    break;
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}